

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::PlatformIsx32(cmMakefile *this)

{
  int iVar1;
  char *__s1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"CMAKE_INTERNAL_PLATFORM_ABI",&local_31);
  __s1 = GetDefinition(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if ((__s1 != (char *)0x0) && (iVar1 = strcmp(__s1,"ELF X32"), iVar1 == 0)) {
    return true;
  }
  return false;
}

Assistant:

bool cmMakefile::PlatformIsx32() const
{
  if (const char* plat_abi =
        this->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI")) {
    if (strcmp(plat_abi, "ELF X32") == 0) {
      return true;
    }
  }
  return false;
}